

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O2

int Abc_NtkHaigResetReprs(Hop_Man_t *p)

{
  int iVar1;
  undefined8 *puVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  undefined8 *puVar5;
  Vec_Ptr_t *p_00;
  int iVar6;
  int iVar7;
  
  iVar6 = 0;
  while( true ) {
    p_00 = p->vObjs;
    iVar1 = p_00->nSize;
    if (iVar1 <= iVar6) break;
    puVar2 = (undefined8 *)Vec_PtrEntry(p_00,iVar6);
    puVar5 = (undefined8 *)*puVar2;
    if (puVar5 == (undefined8 *)0x0) {
      puVar5 = (undefined8 *)0x0;
    }
    else if ((undefined8 *)*puVar5 == puVar2) {
      *puVar5 = puVar5;
      puVar5 = (undefined8 *)*puVar2;
    }
    if (puVar5 == puVar2) {
      *puVar2 = 0;
    }
    iVar6 = iVar6 + 1;
  }
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    pHVar3 = (Hop_Obj_t *)Vec_PtrEntry(p_00,iVar6);
    if ((pHVar3->field_0).pData != (void *)0x0) {
      pHVar4 = Hop_ObjRepr(pHVar3);
      (pHVar4->field_0).pData = pHVar4;
      (pHVar3->field_0).pData = pHVar4;
    }
    p_00 = p->vObjs;
    iVar1 = p_00->nSize;
  }
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    pHVar3 = (Hop_Obj_t *)Vec_PtrEntry(p_00,iVar6);
    if ((pHVar3->field_0).pData != (void *)0x0) {
      pHVar4 = Hop_ObjRepr(pHVar3);
      if (pHVar3->Id < pHVar4->Id) {
        (pHVar4->field_0).pData = pHVar3;
        pHVar4 = pHVar3;
      }
      (pHVar3->field_0).pData = pHVar4;
    }
    p_00 = p->vObjs;
    iVar1 = p_00->nSize;
  }
  iVar6 = 0;
  iVar7 = 0;
  do {
    if (iVar1 <= iVar6) {
      return iVar7;
    }
    pHVar4 = (Hop_Obj_t *)Vec_PtrEntry(p_00,iVar6);
    pHVar3 = (Hop_Obj_t *)(pHVar4->field_0).pData;
    if (pHVar3 != (Hop_Obj_t *)0x0) {
      if (pHVar3 != pHVar4) {
        iVar7 = (iVar7 + 1) - (uint)(*(uint *)&pHVar4->field_0x20 < 0x40);
      }
      pHVar3 = Hop_ObjRepr(pHVar3);
      if ((Hop_Obj_t *)(pHVar4->field_0).pData != pHVar3) {
        __assert_fail("pObj->pData == pRepr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0x202,"int Abc_NtkHaigResetReprs(Hop_Man_t *)");
      }
      if (pHVar4->Id < pHVar3->Id) {
        __assert_fail("pRepr->Id <= pObj->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0x203,"int Abc_NtkHaigResetReprs(Hop_Man_t *)");
      }
    }
    iVar6 = iVar6 + 1;
    p_00 = p->vObjs;
    iVar1 = p_00->nSize;
  } while( true );
}

Assistant:

int Abc_NtkHaigResetReprs( Hop_Man_t * p )
{
    Hop_Obj_t * pObj, * pRepr;
    int i, nClasses, nMembers, nFanouts, nNormals;
    // clear self-classes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        // fix the strange situation of double-loop
        pRepr = (Hop_Obj_t *)pObj->pData;
        if ( pRepr && pRepr->pData == pObj )
            pRepr->pData = pRepr;
        // remove self-loops
        if ( pObj->pData == pObj )
            pObj->pData = NULL;
    }
    // set representatives
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        // get representative of the node
        pRepr = Hop_ObjRepr( pObj );
        pRepr->pData = pRepr;
        // set the representative
        pObj->pData = pRepr;
    }
    // make each class point to the smallest topological order
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        pRepr = Hop_ObjRepr( pObj );
        if ( pRepr->Id > pObj->Id )
        {
            pRepr->pData = pObj;
            pObj->pData = pObj;
        }
        else
            pObj->pData = pRepr;
    }
    // count classes, members, and fanouts - and verify
    nMembers = nClasses = nFanouts = nNormals = 0;
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        // count members
        nMembers++;
        // count the classes and fanouts
        if ( pObj->pData == pObj )
            nClasses++;
        else if ( Hop_ObjRefs(pObj) > 0 )
            nFanouts++;
        else
            nNormals++;
        // compare representatives
        pRepr = Hop_ObjRepr( pObj );
        assert( pObj->pData == pRepr );
        assert( pRepr->Id <= pObj->Id );
    }
//    printf( "Nodes = %7d.  Member = %7d.  Classes = %6d.  Fanouts = %6d.  Normals = %6d.\n", 
//        Hop_ManNodeNum(p), nMembers, nClasses, nFanouts, nNormals );
    return nFanouts;
}